

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  int iVar1;
  int i;
  long lVar2;
  float fVar3;
  
  (*this->m_evalFunc)(ctx);
  if (this->m_areScaleAndBiasEvaluated == false) {
    fVar3 = FloatScalar::getValue(&this->m_scale,this->m_gl,this->m_shaderType);
    this->m_evaluatedScale = fVar3;
    fVar3 = FloatScalar::getValue(&this->m_bias,this->m_gl,this->m_shaderType);
    this->m_evaluatedBias = fVar3;
    this->m_areScaleAndBiasEvaluated = true;
  }
  iVar1 = this->m_resultScalarSize;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    if (s_outSwizzleChannelMasks[lVar2 + (long)(iVar1 + -1) * 4] == '\x01') {
      (ctx->color).m_data[lVar2] =
           (ctx->color).m_data[lVar2] * this->m_evaluatedScale + this->m_evaluatedBias;
    }
  }
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx)
	{
		m_evalFunc(ctx);

		if (!m_areScaleAndBiasEvaluated)
		{
			m_evaluatedScale	= m_scale.getValue(m_gl, m_shaderType);
			m_evaluatedBias		= m_bias.getValue(m_gl, m_shaderType);
			m_areScaleAndBiasEvaluated = true;
		}

		for (int i = 0; i < 4; i++)
			if (s_outSwizzleChannelMasks[m_resultScalarSize-1][i])
				ctx.color[i] = ctx.color[i] * m_evaluatedScale + m_evaluatedBias;
	}